

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O0

void Ioa_WriteAigerBufferTest(Aig_Man_t *pMan,char *pFileName,int fWriteSymbols,int fCompact)

{
  char *__stream;
  int iVar1;
  char *pcVar2;
  int local_34;
  char *pcStack_30;
  int nSize;
  char *pBuffer;
  FILE *pFile;
  int fCompact_local;
  int fWriteSymbols_local;
  char *pFileName_local;
  Aig_Man_t *pMan_local;
  
  pFile._0_4_ = fCompact;
  pFile._4_4_ = fWriteSymbols;
  _fCompact_local = pFileName;
  pFileName_local = (char *)pMan;
  iVar1 = Aig_ManCoNum(pMan);
  if (iVar1 == 0) {
    printf("AIG cannot be written because it has no POs.\n");
  }
  else {
    pBuffer = (char *)fopen(_fCompact_local,"wb");
    if ((FILE *)pBuffer == (FILE *)0x0) {
      fprintf(_stdout,"Ioa_WriteAiger(): Cannot open the output file \"%s\".\n",_fCompact_local);
    }
    else {
      pcStack_30 = Ioa_WriteAigerIntoMemory((Aig_Man_t *)pFileName_local,&local_34);
      fwrite(pcStack_30,1,(long)local_34,(FILE *)pBuffer);
      if (pcStack_30 != (char *)0x0) {
        free(pcStack_30);
        pcStack_30 = (char *)0x0;
      }
      __stream = pBuffer;
      pcVar2 = Ioa_TimeStamp();
      fprintf((FILE *)__stream,"\nThis file was produced by the IOA package in ABC on %s\n",pcVar2);
      fprintf((FILE *)pBuffer,"For information about AIGER format, refer to %s\n",
              "http://fmv.jku.at/aiger");
      fclose((FILE *)pBuffer);
    }
  }
  return;
}

Assistant:

void Ioa_WriteAigerBufferTest( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact )
{
    FILE * pFile;
    char * pBuffer;
    int nSize;
    if ( Aig_ManCoNum(pMan) == 0 )
    {
        printf( "AIG cannot be written because it has no POs.\n" );
        return;
    }
    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Ioa_WriteAiger(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
    // write the buffer
    pBuffer = Ioa_WriteAigerIntoMemory( pMan, &nSize );
    fwrite( pBuffer, 1, nSize, pFile );
    ABC_FREE( pBuffer );
    // write the comment
//    fprintf( pFile, "c" );
//    if ( pMan->pName )
//        fprintf( pFile, "n%s%c", pMan->pName, '\0' );
    fprintf( pFile, "\nThis file was produced by the IOA package in ABC on %s\n", Ioa_TimeStamp() );
    fprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
    fclose( pFile );
}